

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

boolean jtransform_parse_crop_spec(jpeg_transform_info *info,char *spec)

{
  byte *pbVar1;
  byte bVar2;
  boolean bVar3;
  JCROP_CODE JVar4;
  ushort **ppuVar5;
  byte *local_20;
  
  info->crop = 0;
  info->crop_width_set = JCROP_UNSET;
  info->crop_height_set = JCROP_UNSET;
  info->crop_xoffset_set = JCROP_UNSET;
  info->crop_yoffset_set = JCROP_UNSET;
  local_20 = (byte *)spec;
  ppuVar5 = __ctype_b_loc();
  pbVar1 = (byte *)spec;
  if ((*(byte *)((long)*ppuVar5 + (long)*spec * 2 + 1) & 8) != 0) {
    bVar3 = jt_read_integer((char **)&local_20,&info->crop_width);
    if (bVar3 == 0) {
      return 0;
    }
    bVar2 = *local_20;
    JVar4 = JCROP_POS;
    if (bVar2 < 0x66) {
      if (bVar2 == 0x46) {
LAB_001070ff:
        local_20 = local_20 + 1;
        JVar4 = JCROP_FORCE;
      }
      else if (bVar2 == 0x52) goto LAB_00107109;
    }
    else {
      if (bVar2 != 0x72) {
        if (bVar2 != 0x66) goto LAB_00107111;
        goto LAB_001070ff;
      }
LAB_00107109:
      local_20 = local_20 + 1;
      JVar4 = JCROP_REFLECT;
    }
LAB_00107111:
    info->crop_width_set = JVar4;
    pbVar1 = local_20;
  }
  local_20 = pbVar1;
  bVar2 = *local_20;
  if ((bVar2 | 0x20) != 0x78) goto LAB_0010718b;
  local_20 = local_20 + 1;
  bVar3 = jt_read_integer((char **)&local_20,&info->crop_height);
  if (bVar3 == 0) {
    return 0;
  }
  bVar2 = *local_20;
  JVar4 = JCROP_POS;
  if (bVar2 < 0x66) {
    if (bVar2 == 0x46) {
LAB_00107168:
      local_20 = local_20 + 1;
      JVar4 = JCROP_FORCE;
    }
    else if (bVar2 == 0x52) goto LAB_00107177;
  }
  else {
    if (bVar2 != 0x72) {
      if (bVar2 != 0x66) goto LAB_00107184;
      goto LAB_00107168;
    }
LAB_00107177:
    local_20 = local_20 + 1;
    JVar4 = JCROP_REFLECT;
  }
LAB_00107184:
  info->crop_height_set = JVar4;
  bVar2 = *local_20;
LAB_0010718b:
  if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
    info->crop_xoffset_set = (bVar2 == 0x2d) + JCROP_POS;
    local_20 = local_20 + 1;
    bVar3 = jt_read_integer((char **)&local_20,&info->crop_xoffset);
    if (bVar3 == 0) {
      return 0;
    }
    bVar2 = *local_20;
  }
  if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
    info->crop_yoffset_set = (bVar2 == 0x2d) + JCROP_POS;
    local_20 = local_20 + 1;
    bVar3 = jt_read_integer((char **)&local_20,&info->crop_yoffset);
    if (bVar3 == 0) {
      return 0;
    }
    bVar2 = *local_20;
  }
  if (bVar2 == 0) {
    info->crop = 1;
  }
  return (uint)(bVar2 == 0);
}

Assistant:

GLOBAL(boolean)
jtransform_parse_crop_spec(jpeg_transform_info *info, const char *spec)
{
  info->crop = FALSE;
  info->crop_width_set = JCROP_UNSET;
  info->crop_height_set = JCROP_UNSET;
  info->crop_xoffset_set = JCROP_UNSET;
  info->crop_yoffset_set = JCROP_UNSET;

  if (isdigit(*spec)) {
    /* fetch width */
    if (!jt_read_integer(&spec, &info->crop_width))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_width_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_width_set = JCROP_REFLECT;
    } else
      info->crop_width_set = JCROP_POS;
  }
  if (*spec == 'x' || *spec == 'X') {
    /* fetch height */
    spec++;
    if (!jt_read_integer(&spec, &info->crop_height))
      return FALSE;
    if (*spec == 'f' || *spec == 'F') {
      spec++;
      info->crop_height_set = JCROP_FORCE;
    } else if (*spec == 'r' || *spec == 'R') {
      spec++;
      info->crop_height_set = JCROP_REFLECT;
    } else
      info->crop_height_set = JCROP_POS;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch xoffset */
    info->crop_xoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_xoffset))
      return FALSE;
  }
  if (*spec == '+' || *spec == '-') {
    /* fetch yoffset */
    info->crop_yoffset_set = (*spec == '-') ? JCROP_NEG : JCROP_POS;
    spec++;
    if (!jt_read_integer(&spec, &info->crop_yoffset))
      return FALSE;
  }
  /* We had better have gotten to the end of the string. */
  if (*spec != '\0')
    return FALSE;
  info->crop = TRUE;
  return TRUE;
}